

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmd160.c
# Opt level: O0

int rmd160_init(hash_state *md)

{
  undefined8 *in_RDI;
  
  if (in_RDI == (undefined8 *)0x0) {
    fprintf(_stderr,"\nwarning: ARGCHK failed at %s:%d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sonntex[P]smhasher/rmd160.c",
            0x14a);
  }
  *(undefined4 *)((long)in_RDI + 0x4c) = 0x67452301;
  *(undefined4 *)(in_RDI + 10) = 0xefcdab89;
  *(undefined4 *)((long)in_RDI + 0x54) = 0x98badcfe;
  *(undefined4 *)(in_RDI + 0xb) = 0x10325476;
  *(undefined4 *)((long)in_RDI + 0x5c) = 0xc3d2e1f0;
  *(undefined4 *)(in_RDI + 9) = 0;
  *in_RDI = 0;
  return 0;
}

Assistant:

int rmd160_init(hash_state * md)
{
   LTC_ARGCHK(md != NULL);
   md->rmd160.state[0] = 0x67452301UL;
   md->rmd160.state[1] = 0xefcdab89UL;
   md->rmd160.state[2] = 0x98badcfeUL;
   md->rmd160.state[3] = 0x10325476UL;
   md->rmd160.state[4] = 0xc3d2e1f0UL;
   md->rmd160.curlen   = 0;
   md->rmd160.length   = 0;
   return CRYPT_OK;
}